

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O0

bool __thiscall axl::io::Ssl::doHandshake(Ssl *this)

{
  int iVar1;
  undefined8 *in_RDI;
  int in_stack_0000000c;
  Ssl *in_stack_00000010;
  int result;
  
  iVar1 = SSL_do_handshake((SSL *)*in_RDI);
  if (0 >= iVar1) {
    setError(in_stack_00000010,in_stack_0000000c);
  }
  return 0 < iVar1;
}

Assistant:

bool
Ssl::doHandshake() {
	ASSERT(m_h);

	int result = ::SSL_do_handshake(m_h);
	if (result <= 0) {
		setError(result);
		return false;
	}

	return true;
}